

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.hpp
# Opt level: O0

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
          (SparseShaderIntrinsicsCaseBase *this,TestContext *testCtx,string *name,
          SpirVFunction function,ImageType imageType,UVec3 *imageSize,TextureFormat *format)

{
  allocator<char> local_51;
  string local_50;
  UVec3 *local_30;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  SpirVFunction function_local;
  string *name_local;
  TestContext *testCtx_local;
  SparseShaderIntrinsicsCaseBase *this_local;
  
  local_30 = imageSize;
  imageSize_local._0_4_ = imageType;
  imageSize_local._4_4_ = function;
  _imageType_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  TestCase::TestCase(&this->super_TestCase,testCtx,name,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseShaderIntrinsicsCaseBase_016b07e8;
  this->m_function = imageSize_local._4_4_;
  this->m_imageType = (ImageType)imageSize_local;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_imageSize,local_30);
  this->m_format = *format;
  return;
}

Assistant:

SparseShaderIntrinsicsCaseBase			(tcu::TestContext&			testCtx,
											 const std::string&			name,
											 const SpirVFunction		function,
											 const ImageType			imageType,
											 const tcu::UVec3&			imageSize,
											 const tcu::TextureFormat&	format)
		: TestCase(testCtx, name, "")
		, m_function(function)
		, m_imageType(imageType)
		, m_imageSize(imageSize)
		, m_format(format)
	{
	}